

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int JetHead::Socket::getHardwareAddress(char *if_name,char *out_addr)

{
  int iVar1;
  int iVar2;
  char *fmt;
  ifreq ifr;
  
  if (if_name == (char *)0x0 || out_addr == (char *)0x0) {
    fmt = "NULL parameters supplied";
    iVar1 = 2;
    iVar2 = 0x273;
  }
  else {
    iVar1 = socket(2,2,0);
    if (-1 < iVar1) {
      strncpy((char *)&ifr,if_name,0x10);
      ifr.ifr_ifrn.ifrn_name[0xf] = '\0';
      ifr.ifr_ifru.ifru_addr.sa_family = 2;
      iVar2 = ioctl(iVar1,0x8927,&ifr);
      if (iVar2 != 0) {
        jh_log_print(2,"static int JetHead::Socket::getHardwareAddress(const char *, char *)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                     ,0x28b,"failed to get hardware address");
        ::close(iVar1);
        return iVar2;
      }
      sprintf(out_addr,"%02X:%02X:%02X:%02X:%02X:%02X",
              (ulong)(byte)ifr.ifr_ifru.ifru_addr.sa_data[0],
              (ulong)(byte)ifr.ifr_ifru.ifru_addr.sa_data[1],
              (ulong)(byte)ifr.ifr_ifru.ifru_addr.sa_data[2],
              (ulong)(byte)ifr.ifr_ifru.ifru_addr.sa_data[3],
              (ulong)(byte)ifr.ifr_ifru.ifru_addr.sa_data[4],
              (ulong)(byte)ifr.ifr_ifru.ifru_addr.sa_data[5]);
      ::close(iVar1);
      return 0;
    }
    fmt = "socket failed";
    iVar1 = 1;
    iVar2 = 0x27e;
  }
  jh_log_print(iVar1,"static int JetHead::Socket::getHardwareAddress(const char *, char *)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
               ,iVar2,fmt);
  return -1;
}

Assistant:

int Socket::getHardwareAddress(const char *if_name, char *out_addr)
{
#ifdef PLATFORM_DARWIN
	return 0;
#else
	if(not if_name or not out_addr)
	{
		LOG_WARN("NULL parameters supplied");
		return -1;
	}

	// open a socket
	struct ifreq ifr;
	int sockfd;
	
	sockfd = socket(PF_INET, SOCK_DGRAM, 0);
	if(sockfd < 0)
	{
		LOG_ERR_FATAL("socket failed");
		return -1;
	}

	strncpy(ifr.ifr_name, if_name, IFNAMSIZ);
	ifr.ifr_name[IFNAMSIZ -1] = 0;

	ifr.ifr_addr.sa_family = AF_INET;

	int res = ioctl(sockfd, SIOCGIFHWADDR, &ifr);

	if(res)
	{
		LOG_WARN("failed to get hardware address");
	
		::close(sockfd);
		
		return res;
	}

	// copy the hardware address into a temporary buffer (unsigned)
	unsigned char MAC[14];
	memcpy(MAC, &ifr.ifr_ifru.ifru_hwaddr.sa_data, 14);

	// print in MAC-address format
	sprintf(out_addr, "%02X:%02X:%02X:%02X:%02X:%02X",
				MAC[0], MAC[1], MAC[2], MAC[3], MAC[4], MAC[5]);

	::close(sockfd);

	return res;
#endif
}